

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

format_decimal_result<char16_t_*> __thiscall
fmt::v8::detail::format_decimal<char16_t,unsigned__int128>
          (detail *this,char16_t *out,unsigned___int128 value,int size)

{
  ulong uVar1;
  int iVar2;
  undefined8 in_RAX;
  int in_ECX;
  undefined4 in_register_00000014;
  ulong uVar3;
  undefined8 unaff_RBX;
  detail *pdVar4;
  char16_t *pcVar5;
  detail *pdVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  format_decimal_result<char16_t_*> fVar11;
  detail *pdVar12;
  
  uVar3 = CONCAT44(in_register_00000014,size);
  auVar10._8_8_ = unaff_RBX;
  auVar10._0_8_ = in_RAX;
  iVar2 = count_digits_fallback<unsigned__int128>((detail *)out,(unsigned___int128)auVar10);
  if (in_ECX < iVar2) {
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
               ,0x45e,"invalid digit count");
  }
  pdVar4 = this + (long)in_ECX * 2;
  pcVar5 = out;
  pdVar6 = pdVar4;
  uVar7 = uVar3;
  pdVar12 = pdVar4;
  if ((out < (char16_t *)0x64) <= uVar3) {
    do {
      pdVar4 = pdVar6 + -4;
      auVar10 = __udivti3(pcVar5,uVar7,100,0);
      uVar3 = auVar10._8_8_;
      out = auVar10._0_8_;
      *(short *)(pdVar6 + -4) =
           (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                  [(long)(pcVar5 + (long)out * -0x32) * 2];
      bVar8 = (char16_t *)0x270f < pcVar5;
      bVar9 = uVar7 != 0;
      uVar1 = -uVar7;
      *(short *)(pdVar6 + -2) =
           (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                  [(long)(pcVar5 + (long)out * -0x32) * 2 + 1];
      pcVar5 = out;
      pdVar6 = pdVar4;
      uVar7 = uVar3;
    } while (bVar9 || uVar1 < bVar8);
  }
  if (uVar3 == 0 && (ulong)((char16_t *)0x9 < out) <= -uVar3) {
    *(ushort *)(pdVar4 + -2) = (ushort)out | 0x30;
    pdVar4 = pdVar4 + -2;
  }
  else {
    *(short *)(pdVar4 + -4) =
         (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                [(long)out * 2];
    *(short *)(pdVar4 + -2) =
         (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                [(long)out * 2 + 1];
    pdVar4 = pdVar4 + -4;
  }
  fVar11.end = (char16_t *)pdVar12;
  fVar11.begin = (char16_t *)pdVar4;
  return fVar11;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}